

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

XMLAttDef * __thiscall
xercesc_4_0::DTDScanner::scanAttDef(DTDScanner *this,DTDElementDecl *parentElem,XMLBuffer *bufToUse)

{
  uint uVar1;
  DefAttTypes DVar2;
  XMLScanner *pXVar3;
  XMLValidator *this_00;
  DocTypeHandler *pDVar4;
  bool bVar5;
  int iVar6;
  DTDAttDef *pDVar7;
  XMLCh *text2;
  DTDAttDef *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BaseRefVectorOf<char16_t> *this_02;
  char16_t *pcVar8;
  undefined4 extraout_var_01;
  XMLCh *pXVar9;
  XMLCh fgPreserve [9];
  XMLCh fgDefault [8];
  XMLCh fgXMLSpace [10];
  
  checkForPERef(this,false,true);
  bVar5 = ReaderMgr::getName(this->fReaderMgr,bufToUse);
  if (!bVar5) {
    XMLScanner::emitError(this->fScanner,ExpectedAttrName);
    return (XMLAttDef *)0x0;
  }
  pXVar9 = bufToUse->fBuffer;
  pXVar9[bufToUse->fIndex] = L'\0';
  pDVar7 = DTDElementDecl::getAttDef(parentElem,pXVar9);
  if (pDVar7 == (DTDAttDef *)0x0) {
    this_01 = (DTDAttDef *)XMemory::operator_new(0x48,this->fGrammarPoolMemoryManager);
    pXVar9 = bufToUse->fBuffer;
    pXVar9[bufToUse->fIndex] = L'\0';
    DTDAttDef::DTDAttDef(this_01,pXVar9,AttTypes_Min,Implied,this->fGrammarPoolMemoryManager);
    uVar1 = this->fNextAttrId;
    this->fNextAttrId = uVar1 + 1;
    (this_01->super_XMLAttDef).fId = (ulong)uVar1;
    (this_01->super_XMLAttDef).fExternalAttribute =
         this->fDocTypeReaderId != this->fReaderMgr->fCurReader->fReaderNum;
    DTDElementDecl::addAttDef(parentElem,this_01);
    pDVar7 = this->fDumAttDef;
  }
  else {
    pXVar3 = this->fScanner;
    pXVar9 = bufToUse->fBuffer;
    pXVar9[bufToUse->fIndex] = L'\0';
    text2 = XMLElementDecl::getFullName(&parentElem->super_XMLElementDecl);
    XMLScanner::emitError(pXVar3,AttListAlreadyExists,pXVar9,text2,(XMLCh *)0x0,(XMLCh *)0x0);
    pDVar7 = this->fDumAttDef;
    if (pDVar7 == (DTDAttDef *)0x0) {
      pDVar7 = (DTDAttDef *)XMemory::operator_new(0x48,this->fMemoryManager);
      DTDAttDef::DTDAttDef(pDVar7,this->fMemoryManager);
      this->fDumAttDef = pDVar7;
      uVar1 = this->fNextAttrId;
      this->fNextAttrId = uVar1 + 1;
      (pDVar7->super_XMLAttDef).fId = (ulong)uVar1;
    }
    pXVar9 = bufToUse->fBuffer;
    pXVar9[bufToUse->fIndex] = L'\0';
    DTDAttDef::setName(pDVar7,pXVar9);
    pDVar7 = this->fDumAttDef;
    this_01 = pDVar7;
  }
  bVar5 = checkForPERef(this,false,true);
  if (!bVar5) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  bVar5 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgCDATAString);
  if (bVar5) {
    (this_01->super_XMLAttDef).fType = AttTypes_Min;
  }
  else {
    bVar5 = ReaderMgr::skippedString(this->fReaderMgr,L"ID");
    if (bVar5) {
      bVar5 = ReaderMgr::skippedString(this->fReaderMgr,L"REF");
      if (bVar5) {
        bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'S');
        if (bVar5) {
          (this_01->super_XMLAttDef).fType = IDRefs;
        }
        else {
          (this_01->super_XMLAttDef).fType = IDRef;
        }
      }
      else {
        (this_01->super_XMLAttDef).fType = ID;
      }
    }
    else {
      bVar5 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgEntitString);
      if (bVar5) {
        bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'Y');
        if (bVar5) {
          (this_01->super_XMLAttDef).fType = Entity;
        }
        else {
          bVar5 = ReaderMgr::skippedString(this->fReaderMgr,L"IES");
          if (!bVar5) {
LAB_002f7c57:
            pXVar3 = this->fScanner;
            iVar6 = (*(this_01->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])
                              (this_01);
            pXVar9 = XMLElementDecl::getFullName(&parentElem->super_XMLElementDecl);
            XMLScanner::emitError
                      (pXVar3,ExpectedAttributeType,(XMLCh *)CONCAT44(extraout_var_01,iVar6),pXVar9,
                       (XMLCh *)0x0,(XMLCh *)0x0);
            return (XMLAttDef *)0x0;
          }
          (this_01->super_XMLAttDef).fType = Entities;
        }
      }
      else {
        bVar5 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgNmTokenString);
        if (bVar5) {
          bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'S');
          if (bVar5) {
            (this_01->super_XMLAttDef).fType = NmTokens;
          }
          else {
            (this_01->super_XMLAttDef).fType = NmToken;
          }
        }
        else {
          bVar5 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgNotationString);
          if (bVar5) {
            bVar5 = checkForPERef(this,false,true);
            if (!bVar5) {
              XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
            }
            (this_01->super_XMLAttDef).fType = Notation;
            bVar5 = true;
          }
          else {
            bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'(');
            if (!bVar5) goto LAB_002f7c57;
            (this_01->super_XMLAttDef).fType = Enumeration;
            bVar5 = false;
          }
          bVar5 = scanEnumeration(this,this_01,bufToUse,bVar5);
          if (!bVar5) {
            return (XMLAttDef *)0x0;
          }
          pXVar9 = bufToUse->fBuffer;
          pXVar9[bufToUse->fIndex] = L'\0';
          XMLAttDef::setEnumeration(&this_01->super_XMLAttDef,pXVar9);
        }
      }
    }
  }
  bVar5 = checkForPERef(this,false,true);
  if (!bVar5) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  scanDefaultDecl(this,this_01);
  if (this->fScanner->fValScheme != Val_Always) goto LAB_002f7cee;
  if ((((this_01->super_XMLAttDef).fType == ID) &&
      (DVar2 = (this_01->super_XMLAttDef).fDefaultType, DVar2 != Required)) && (DVar2 != Implied)) {
    this_00 = this->fScanner->fValidator;
    iVar6 = (*(this_01->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(this_01);
    XMLValidator::emitError
              (this_00,BadIDAttrDefType,(XMLCh *)CONCAT44(extraout_var,iVar6),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0);
  }
  builtin_memcpy(fgXMLSpace,L"xml:space",0x14);
  iVar6 = (*(this_01->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(this_01);
  bVar5 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar6),fgXMLSpace);
  if (!bVar5) goto LAB_002f7cee;
  builtin_memcpy(fgPreserve,L"preserve",0x12);
  builtin_memcpy(fgDefault,L"default",0x10);
  if ((this_01->super_XMLAttDef).fType == Enumeration) {
    this_02 = XMLString::tokenizeString
                        ((this_01->super_XMLAttDef).fEnumeration,this->fMemoryManager);
    if (this_02->fCurCount == 2) {
      pcVar8 = BaseRefVectorOf<char16_t>::elementAt(this_02,0);
      bVar5 = XMLString::equals(pcVar8,fgDefault);
      if (bVar5) {
        pcVar8 = BaseRefVectorOf<char16_t>::elementAt(this_02,1);
        bVar5 = XMLString::equals(pcVar8,fgPreserve);
        if (bVar5) goto LAB_002f7bf0;
      }
      pcVar8 = BaseRefVectorOf<char16_t>::elementAt(this_02,1);
      bVar5 = XMLString::equals(pcVar8,fgDefault);
      if (bVar5) {
        pcVar8 = BaseRefVectorOf<char16_t>::elementAt(this_02,0);
        bVar5 = XMLString::equals(pcVar8,fgPreserve);
        (*this_02->_vptr_BaseRefVectorOf[1])(this_02);
        if (bVar5) goto LAB_002f7cee;
        goto LAB_002f7cdb;
      }
    }
    else if (this_02->fCurCount == 1) {
      pcVar8 = BaseRefVectorOf<char16_t>::elementAt(this_02,0);
      bVar5 = XMLString::equals(pcVar8,fgDefault);
      if (!bVar5) {
        pcVar8 = BaseRefVectorOf<char16_t>::elementAt(this_02,0);
        bVar5 = XMLString::equals(pcVar8,fgPreserve);
        if (!bVar5) goto LAB_002f7cd1;
      }
LAB_002f7bf0:
      (*this_02->_vptr_BaseRefVectorOf[1])(this_02);
      goto LAB_002f7cee;
    }
LAB_002f7cd1:
    (*this_02->_vptr_BaseRefVectorOf[1])(this_02);
  }
LAB_002f7cdb:
  XMLValidator::emitError(this->fScanner->fValidator,IllegalXMLSpace);
LAB_002f7cee:
  pDVar4 = this->fDocTypeHandler;
  if (pDVar4 != (DocTypeHandler *)0x0) {
    (*pDVar4->_vptr_DocTypeHandler[2])(pDVar4,parentElem,this_01,(ulong)(this_01 == pDVar7));
  }
  return &this_01->super_XMLAttDef;
}

Assistant:

XMLAttDef*
DTDScanner::scanAttDef(DTDElementDecl& parentElem, XMLBuffer& bufToUse)
{
    // Check for PE ref or optional whitespace
    checkForPERef(false, true);

    // Get the name of the attribute
    if (!fReaderMgr->getName(bufToUse))
    {
        fScanner->emitError(XMLErrs::ExpectedAttrName);
        return 0;
    }

    //
    //  Look up this attribute in the parent element's attribute list. If
    //  it already exists, then use the dummy.
    //
    DTDAttDef* decl = parentElem.getAttDef(bufToUse.getRawBuffer());
    if (decl)
    {
        // It already exists, so put out a warning
        fScanner->emitError
        (
            XMLErrs::AttListAlreadyExists
            , bufToUse.getRawBuffer()
            , parentElem.getFullName()
        );

        // Use the dummy decl to parse into and set its name to the name we got
        if (!fDumAttDef)
        {
            fDumAttDef = new (fMemoryManager) DTDAttDef(fMemoryManager);
            fDumAttDef->setId(fNextAttrId++);
        }
        fDumAttDef->setName(bufToUse.getRawBuffer());
        decl = fDumAttDef;
    }
     else
    {
        //
        //  It does not already exist so create a new one, give it the next
        //  available unique id, and add it
        //
        decl = new (fGrammarPoolMemoryManager) DTDAttDef
        (
            bufToUse.getRawBuffer()
            , XMLAttDef::CData
            , XMLAttDef::Implied
            , fGrammarPoolMemoryManager
        );
        decl->setId(fNextAttrId++);
        decl->setExternalAttDeclaration(isReadingExternalEntity());
        parentElem.addAttDef(decl);
    }

    // Set a flag to indicate whether we are doing a dummy parse
    const bool isIgnored = (decl == fDumAttDef);

    // Space is required here, so check for PE ref, and require space
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    //
    //  Next has to be one of the attribute type strings. This tells us what
    //  is to follow.
    //
    if (fReaderMgr->skippedString(XMLUni::fgCDATAString))
    {
        decl->setType(XMLAttDef::CData);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgIDString))
    {
        if (!fReaderMgr->skippedString(XMLUni::fgRefString))
            decl->setType(XMLAttDef::ID);
        else if (!fReaderMgr->skippedChar(chLatin_S))
            decl->setType(XMLAttDef::IDRef);
        else
            decl->setType(XMLAttDef::IDRefs);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgEntitString))
    {
        if (fReaderMgr->skippedChar(chLatin_Y))
        {
            decl->setType(XMLAttDef::Entity);
        }
         else if (fReaderMgr->skippedString(XMLUni::fgIESString))
        {
            decl->setType(XMLAttDef::Entities);
        }
         else
        {
            fScanner->emitError
            (
                XMLErrs::ExpectedAttributeType
                , decl->getFullName()
                , parentElem.getFullName()
            );
            return 0;
        }
    }
     else if (fReaderMgr->skippedString(XMLUni::fgNmTokenString))
    {
        if (fReaderMgr->skippedChar(chLatin_S))
            decl->setType(XMLAttDef::NmTokens);
        else
            decl->setType(XMLAttDef::NmToken);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgNotationString))
    {
        // Check for PE ref and require space
        if (!checkForPERef(false, true))
            fScanner->emitError(XMLErrs::ExpectedWhitespace);

        decl->setType(XMLAttDef::Notation);
        if (!scanEnumeration(*decl, bufToUse, true))
            return 0;

        // Set the value as the enumeration for this decl
        decl->setEnumeration(bufToUse.getRawBuffer());
    }
     else if (fReaderMgr->skippedChar(chOpenParen))
    {
        decl->setType(XMLAttDef::Enumeration);
        if (!scanEnumeration(*decl, bufToUse, false))
            return 0;

        // Set the value as the enumeration for this decl
        decl->setEnumeration(bufToUse.getRawBuffer());
    }
     else
    {
        fScanner->emitError
        (
            XMLErrs::ExpectedAttributeType
            , decl->getFullName()
            , parentElem.getFullName()
        );
        return 0;
    }

    // Space is required here, so check for PE ref, and require space
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // And then scan for the optional default value declaration
    scanDefaultDecl(*decl);

    // If validating, then do a couple of validation constraints
    if (fScanner->getValidationScheme() == XMLScanner::Val_Always)
    {
        if (decl->getType() == XMLAttDef::ID)
        {
            if ((decl->getDefaultType() != XMLAttDef::Implied)
            &&  (decl->getDefaultType() != XMLAttDef::Required))
            {
                fScanner->getValidator()->emitError(XMLValid::BadIDAttrDefType, decl->getFullName());
            }
        }

        // if attdef is xml:space, check correct enumeration (default|preserve)
        const XMLCh fgXMLSpace[] = { chLatin_x, chLatin_m, chLatin_l, chColon, chLatin_s, chLatin_p, chLatin_a, chLatin_c, chLatin_e, chNull };

        if (XMLString::equals(decl->getFullName(),fgXMLSpace)) {
            const XMLCh fgPreserve[] = { chLatin_p, chLatin_r, chLatin_e, chLatin_s, chLatin_e, chLatin_r, chLatin_v, chLatin_e, chNull };
            const XMLCh fgDefault[] = { chLatin_d, chLatin_e, chLatin_f, chLatin_a, chLatin_u, chLatin_l, chLatin_t, chNull };
            bool ok = false;
            if (decl->getType() == XMLAttDef::Enumeration) {
                BaseRefVectorOf<XMLCh>* enumVector = XMLString::tokenizeString(decl->getEnumeration(), fMemoryManager);
                XMLSize_t size = enumVector->size();
                ok = (size == 1 &&
                     (XMLString::equals(enumVector->elementAt(0), fgDefault) ||
                      XMLString::equals(enumVector->elementAt(0), fgPreserve))) ||
                     (size == 2 &&
                     (XMLString::equals(enumVector->elementAt(0), fgDefault) &&
                      XMLString::equals(enumVector->elementAt(1), fgPreserve))) ||
                     (size == 2 &&
                     (XMLString::equals(enumVector->elementAt(1), fgDefault) &&
                      XMLString::equals(enumVector->elementAt(0), fgPreserve)));
                delete enumVector;
            }
            if (!ok)
                fScanner->getValidator()->emitError(XMLValid::IllegalXMLSpace);
        }
    }

    // If we have a doc type handler, tell it about this attdef.
    if (fDocTypeHandler)
        fDocTypeHandler->attDef(parentElem, *decl, isIgnored);
    return decl;
}